

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int solution(set<int,_std::less<int>,_std::allocator<int>_> *nodes,
            map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
            *inc,map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
                 *r_inc)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  ostream *poVar4;
  reference piVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  int *piVar9;
  pointer ppVar10;
  iterator local_138;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_130;
  iterator local_128;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_120;
  const_iterator i_1;
  int max;
  int local_fc;
  iterator local_f8;
  _List_const_iterator<int> local_f0;
  iterator local_e8;
  _List_const_iterator<int> local_e0;
  const_iterator j;
  list<int,_std::allocator<int>_> l;
  _List_const_iterator<int> local_b8;
  iterator local_b0;
  _List_const_iterator<int> local_a8;
  iterator local_a0;
  _List_const_iterator<int> local_98;
  const_iterator k;
  _Self local_78;
  _Self local_70;
  const_iterator i;
  list<int,_std::allocator<int>_> starts;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> n;
  map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
  *r_inc_local;
  map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
  *inc_local;
  set<int,_std::less<int>,_std::allocator<int>_> *nodes_local;
  
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)&i);
  local_70._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(nodes);
  while( true ) {
    local_78._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(nodes);
    bVar2 = std::operator!=(&local_70,&local_78);
    if (!bVar2) break;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&local_70);
    pmVar6 = std::
             map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
             ::operator[](r_inc,piVar3);
    bVar2 = std::__cxx11::list<int,_std::allocator<int>_>::empty(pmVar6);
    if (bVar2) {
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&local_70);
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)&i,piVar3);
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&local_70);
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                              _M_size,piVar3);
      *pmVar7 = 1;
    }
    k._M_node = (_List_node_base *)std::_Rb_tree_const_iterator<int>::operator++(&local_70,0);
  }
  local_a0._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin((list<int,_std::allocator<int>_> *)&i);
  std::_List_const_iterator<int>::_List_const_iterator(&local_98,&local_a0);
  local_b0._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::end((list<int,_std::allocator<int>_> *)&i);
  std::_List_const_iterator<int>::_List_const_iterator(&local_a8,&local_b0);
  bVar2 = std::operator!=(&local_a8,&local_98);
  if (bVar2) {
    while( true ) {
      l.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
           (size_t)std::__cxx11::list<int,_std::allocator<int>_>::end
                             ((list<int,_std::allocator<int>_> *)&i);
      std::_List_const_iterator<int>::_List_const_iterator
                (&local_b8,
                 (iterator *)&l.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size)
      ;
      bVar2 = std::operator!=(&local_b8,&local_98);
      if (!bVar2) break;
      poVar4 = std::operator<<((ostream *)&std::cerr,"process ");
      piVar5 = std::_List_const_iterator<int>::operator*(&local_98);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      piVar5 = std::_List_const_iterator<int>::operator*(&local_98);
      pmVar6 = std::
               map<int,_std::__cxx11::list<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<int,_std::allocator<int>_>_>_>_>
               ::operator[](inc,piVar5);
      std::__cxx11::list<int,_std::allocator<int>_>::list
                ((list<int,_std::allocator<int>_> *)&j,pmVar6);
      local_e8._M_node =
           (_List_node_base *)
           std::__cxx11::list<int,_std::allocator<int>_>::begin
                     ((list<int,_std::allocator<int>_> *)&j);
      std::_List_const_iterator<int>::_List_const_iterator(&local_e0,&local_e8);
      while( true ) {
        local_f8._M_node =
             (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::end
                       ((list<int,_std::allocator<int>_> *)&j);
        std::_List_const_iterator<int>::_List_const_iterator(&local_f0,&local_f8);
        bVar2 = std::operator!=(&local_e0,&local_f0);
        if (!bVar2) break;
        piVar5 = std::_List_const_iterator<int>::operator*(&local_e0);
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                                _M_size,piVar5);
        if (*pmVar7 == 0) {
          piVar5 = std::_List_const_iterator<int>::operator*(&local_e0);
          std::__cxx11::list<int,_std::allocator<int>_>::push_back
                    ((list<int,_std::allocator<int>_> *)&i,piVar5);
        }
        piVar5 = std::_List_const_iterator<int>::operator*(&local_e0);
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                                _M_size,piVar5);
        piVar5 = std::_List_const_iterator<int>::operator*(&local_98);
        pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                                _M_size,piVar5);
        local_fc = *pmVar8 + 1;
        piVar9 = std::max<int>(pmVar7,&local_fc);
        iVar1 = *piVar9;
        piVar5 = std::_List_const_iterator<int>::operator*(&local_e0);
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                                _M_size,piVar5);
        *pmVar7 = iVar1;
        std::_List_const_iterator<int>::operator++(&local_e0,0);
      }
      std::_List_const_iterator<int>::operator++(&local_98,0);
      std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)&j);
    }
    i_1._M_node._4_4_ = 0;
    local_128._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    &starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
              (&local_120,&local_128);
    while( true ) {
      local_138._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
      std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
                (&local_130,&local_138);
      bVar2 = std::operator!=(&local_120,&local_130);
      iVar1 = i_1._M_node._4_4_;
      if (!bVar2) break;
      ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_120);
      if (i_1._M_node._4_4_ < ppVar10->second) {
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_120);
        i_1._M_node._4_4_ = ppVar10->second;
      }
      std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(&local_120,0);
    }
    std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)&i);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &starts.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
    return iVar1;
  }
  __assert_fail("starts.end() != k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/dwarfs/main.cpp"
                ,0x20,
                "int solution(std::set<int> &, std::map<int, std::list<int>> &, std::map<int, std::list<int>> &)"
               );
}

Assistant:

int solution(std::set<int>& nodes, std::map<int, std::list<int> >& inc, std::map<int, std::list<int> >& r_inc)
{
    std::map<int, int> n;
    std::list<int> starts;
    
    for (std::set<int>::const_iterator i = nodes.begin(); i != nodes.end(); i++)
    {
        if (r_inc[*i].empty())
        {
            starts.push_back(*i);
            n[*i] = 1;
        }
    }
    
    std::list<int>::const_iterator k = starts.begin();
    assert(starts.end() != k);
    while (starts.end() != k)
    {
        cerr << "process " << *k << endl;
        std::list<int> l = inc[*k];
        for (std::list<int>::const_iterator j = l.begin(); j != l.end(); j++)
        {
            if (0 == n[*j])
            {
                starts.push_back(*j);
            }
            n[*j] = std::max(n[*j], n[*k] + 1);
        }
        k++;
    }
    
    int max = 0;
    for (std::map<int, int>::const_iterator i = n.begin(); i != n.end(); i++)
    {
        if (i->second > max)
        {
            max = i->second;
        }
    }
    return max;
}